

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O0

opt_t * __thiscall re2c::opt_t::operator=(opt_t *this,opt_t *opt)

{
  opt_t *opt_local;
  opt_t *this_local;
  
  this->target = opt->target;
  this->bNoGenerationDate = (bool)(opt->bNoGenerationDate & 1);
  this->version = (bool)(opt->version & 1);
  this->encoding = opt->encoding;
  this->bCaseInsensitive = (bool)(opt->bCaseInsensitive & 1);
  this->bCaseInverted = (bool)(opt->bCaseInverted & 1);
  this->empty_class_policy = opt->empty_class_policy;
  this->cFlag = (bool)(opt->cFlag & 1);
  this->tFlag = (bool)(opt->tFlag & 1);
  this->header_file = opt->header_file;
  std::__cxx11::string::operator=((string *)&this->yycondtype,(string *)&opt->yycondtype);
  std::__cxx11::string::operator=((string *)&this->cond_get,(string *)&opt->cond_get);
  this->cond_get_naked = (bool)(opt->cond_get_naked & 1);
  std::__cxx11::string::operator=((string *)&this->cond_set,(string *)&opt->cond_set);
  std::__cxx11::string::operator=((string *)&this->cond_set_arg,(string *)&opt->cond_set_arg);
  this->cond_set_naked = (bool)(opt->cond_set_naked & 1);
  std::__cxx11::string::operator=((string *)&this->yyctable,(string *)&opt->yyctable);
  std::__cxx11::string::operator=((string *)&this->condPrefix,(string *)&opt->condPrefix);
  std::__cxx11::string::operator=((string *)&this->condEnumPrefix,(string *)&opt->condEnumPrefix);
  std::__cxx11::string::operator=((string *)&this->condDivider,(string *)&opt->condDivider);
  std::__cxx11::string::operator=
            ((string *)&this->condDividerParam,(string *)&opt->condDividerParam);
  std::__cxx11::string::operator=((string *)&this->condGoto,(string *)&opt->condGoto);
  std::__cxx11::string::operator=((string *)&this->condGotoParam,(string *)&opt->condGotoParam);
  this->fFlag = (bool)(opt->fFlag & 1);
  std::__cxx11::string::operator=((string *)&this->state_get,(string *)&opt->state_get);
  this->state_get_naked = (bool)(opt->state_get_naked & 1);
  std::__cxx11::string::operator=((string *)&this->state_set,(string *)&opt->state_set);
  std::__cxx11::string::operator=((string *)&this->state_set_arg,(string *)&opt->state_set_arg);
  this->state_set_naked = (bool)(opt->state_set_naked & 1);
  std::__cxx11::string::operator=((string *)&this->yyfilllabel,(string *)&opt->yyfilllabel);
  std::__cxx11::string::operator=((string *)&this->yynext,(string *)&opt->yynext);
  std::__cxx11::string::operator=((string *)&this->yyaccept,(string *)&opt->yyaccept);
  this->bUseStateAbort = (bool)(opt->bUseStateAbort & 1);
  this->bUseStateNext = (bool)(opt->bUseStateNext & 1);
  this->rFlag = (bool)(opt->rFlag & 1);
  this->FFlag = (bool)(opt->FFlag & 1);
  this->sFlag = (bool)(opt->sFlag & 1);
  this->bFlag = (bool)(opt->bFlag & 1);
  std::__cxx11::string::operator=((string *)&this->yybm,(string *)&opt->yybm);
  this->yybmHexTable = (bool)(opt->yybmHexTable & 1);
  this->gFlag = (bool)(opt->gFlag & 1);
  std::__cxx11::string::operator=((string *)&this->yytarget,(string *)&opt->yytarget);
  this->cGotoThreshold = opt->cGotoThreshold;
  this->topIndent = opt->topIndent;
  std::__cxx11::string::operator=((string *)&this->indString,(string *)&opt->indString);
  (this->input_api).type_ = (opt->input_api).type_;
  std::__cxx11::string::operator=((string *)&this->yycursor,(string *)&opt->yycursor);
  std::__cxx11::string::operator=((string *)&this->yymarker,(string *)&opt->yymarker);
  std::__cxx11::string::operator=((string *)&this->yyctxmarker,(string *)&opt->yyctxmarker);
  std::__cxx11::string::operator=((string *)&this->yylimit,(string *)&opt->yylimit);
  std::__cxx11::string::operator=((string *)&this->yypeek,(string *)&opt->yypeek);
  std::__cxx11::string::operator=((string *)&this->yyskip,(string *)&opt->yyskip);
  std::__cxx11::string::operator=((string *)&this->yybackup,(string *)&opt->yybackup);
  std::__cxx11::string::operator=((string *)&this->yybackupctx,(string *)&opt->yybackupctx);
  std::__cxx11::string::operator=((string *)&this->yyrestore,(string *)&opt->yyrestore);
  std::__cxx11::string::operator=((string *)&this->yyrestorectx,(string *)&opt->yyrestorectx);
  std::__cxx11::string::operator=((string *)&this->yylessthan,(string *)&opt->yylessthan);
  this->iFlag = (bool)(opt->iFlag & 1);
  this->dFlag = (bool)(opt->dFlag & 1);
  std::__cxx11::string::operator=((string *)&this->yydebug,(string *)&opt->yydebug);
  std::__cxx11::string::operator=((string *)&this->yyctype,(string *)&opt->yyctype);
  std::__cxx11::string::operator=((string *)&this->yych,(string *)&opt->yych);
  this->bEmitYYCh = (bool)(opt->bEmitYYCh & 1);
  this->yychConversion = (bool)(opt->yychConversion & 1);
  std::__cxx11::string::operator=((string *)&this->fill,(string *)&opt->fill);
  this->fill_use = (bool)(opt->fill_use & 1);
  this->fill_check = (bool)(opt->fill_check & 1);
  std::__cxx11::string::operator=((string *)&this->fill_arg,(string *)&opt->fill_arg);
  this->fill_arg_use = (bool)(opt->fill_arg_use & 1);
  this->fill_naked = (bool)(opt->fill_naked & 1);
  std::__cxx11::string::operator=((string *)&this->labelPrefix,(string *)&opt->labelPrefix);
  this->dfa_minimization = opt->dfa_minimization;
  return this;
}

Assistant:

opt_t & opt_t::operator = (const opt_t & opt)
{
#define OPT1 OPT
#define OPT(type, name, value) name = opt.name;
	RE2C_OPTS
#undef OPT1
#undef OPT
	return *this;
}